

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::ImplicationConstraint::fromSyntax
          (ImplicationConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ImplicationConstraint *ctrl;
  Constraint *pCVar3;
  socklen_t __len;
  ConstraintExprVisitor local_38;
  Expression *args;
  
  compilation = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->left).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  iVar2 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)context,__len);
  ctrl = BumpAllocator::
         emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
                   (&compilation->super_BumpAllocator,args,
                    (Constraint *)CONCAT44(extraout_var_00,iVar2));
  bVar1 = Expression::bad(args);
  if ((!bVar1) && (((Constraint *)CONCAT44(extraout_var_00,iVar2))->kind != Invalid)) {
    local_38.failed = false;
    local_38.isTop = true;
    local_38.sawRandVars = false;
    local_38.isSoft = false;
    local_38.context = context;
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>(args,&local_38);
    if (!bVar1) {
      ctrl = (ImplicationConstraint *)Constraint::badConstraint(compilation,&ctrl->super_Constraint)
      ;
    }
    return &ctrl->super_Constraint;
  }
  pCVar3 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar3;
}

Assistant:

Constraint& ImplicationConstraint::fromSyntax(const ImplicationConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.left, context);
    auto& body = Constraint::bind(*syntax.constraints, context);
    auto result = comp.emplace<ImplicationConstraint>(pred, body);
    if (pred.bad() || body.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}